

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int binchrr(bstring b0,int pos,bstring b1)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  charField chrs;
  charField local_60;
  
  if ((((b0 != (bstring)0x0 && -1 < pos) && (puVar3 = b0->data, puVar3 != (uchar *)0x0)) &&
      (iVar2 = b0->slen, pos <= iVar2)) &&
     ((iVar5 = buildCharField(&local_60,b1), -1 < iVar5 &&
      (uVar6 = pos - (uint)(iVar2 == pos), -1 < (int)uVar6)))) {
    do {
      bVar1 = puVar3[uVar6];
      if (((uint)local_60.content[bVar1 >> 5] >> (bVar1 & 0x1f) & 1) != 0) {
        return uVar6;
      }
      bVar4 = 0 < (int)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar4);
  }
  return -1;
}

Assistant:

int binchrr (const bstring b0, int pos, const bstring b1) {
struct charField chrs;
	if (pos < 0 || b0 == NULL || b0->data == NULL ||
	    b0->slen < pos) return BSTR_ERR;
	if (pos == b0->slen) pos--;
	if (buildCharField (&chrs, b1) < 0) return BSTR_ERR;
	return binchrrCF (b0->data, pos, &chrs);
}